

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> * __thiscall
gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::operator=
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *a)

{
  long lVar1;
  long lVar2;
  
  setSize(this,a->width,a->height,(long)a->depth);
  lVar1 = this->n;
  lVar2 = -lVar1;
  if (0 < lVar1) {
    lVar2 = lVar1;
  }
  memcpy(this->pixel,a->pixel,lVar2 * 2);
  return this;
}

Assistant:

Image<T> &operator=(const Image<T> &a)
    {
      setSize(a.getWidth(), a.getHeight(), a.getDepth());

      memcpy(pixel, a.pixel, std::abs(n)*sizeof(T));

      return *this;
    }